

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

matrix2d * tinyusdz::value::matrix2d::identity(void)

{
  matrix2d *in_RDI;
  matrix2d *m;
  
  matrix2d(in_RDI);
  in_RDI->m[0][0] = 1.0;
  in_RDI->m[0][1] = 0.0;
  in_RDI->m[1][0] = 0.0;
  in_RDI->m[1][1] = 1.0;
  return in_RDI;
}

Assistant:

static matrix2d identity() {
    matrix2d m;

    m.m[0][0] = 1.0;
    m.m[0][1] = 0.0;

    m.m[1][0] = 0.0;
    m.m[1][1] = 1.0;

    return m;
  }